

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

int Io_ReadPlaRemoveMarked(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  word *pwVar1;
  word *pwVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = 0;
  uVar7 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar7 = uVar6;
  }
  uVar8 = (ulong)(uint)nCubes;
  if (nCubes < 1) {
    uVar8 = uVar6;
  }
  uVar4 = 0;
  for (; iVar5 = (int)uVar4, uVar6 != uVar8; uVar6 = uVar6 + 1) {
    iVar3 = Vec_BitEntry(vMarks,(int)uVar6);
    if (iVar3 == 0) {
      if (uVar6 != uVar4) {
        pwVar1 = pCs[iVar5];
        pwVar2 = pCs[uVar6];
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          pwVar1[uVar4] = pwVar2[uVar4];
        }
      }
      uVar4 = (ulong)(iVar5 + 1);
    }
  }
  return iVar5;
}

Assistant:

int Io_ReadPlaRemoveMarked( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c;
    for ( c1 = c = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
        {
            if ( c == c1 )
                c++;
            else
                Abc_TtCopy( pCs[c++], pCs[c1], nWords, 0 );
        }
    return c;
}